

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterfaceInfo.cpp
# Opt level: O0

PublicationInfo * __thiscall
helics::InterfaceInfo::getPublication(InterfaceInfo *this,InterfaceHandle handle)

{
  PublicationInfo *pPVar1;
  shared_guarded<gmlc::containers::DualMappedPointerVector<helics::PublicationInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
  *this_00;
  InterfaceHandle *in_stack_ffffffffffffffd0;
  DualMappedPointerVector<helics::PublicationInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>
  *in_stack_ffffffffffffffd8;
  
  this_00 = (shared_guarded<gmlc::containers::DualMappedPointerVector<helics::PublicationInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
             *)&stack0xffffffffffffffd8;
  gmlc::libguarded::
  shared_guarded<gmlc::containers::DualMappedPointerVector<helics::PublicationInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
  ::lock(this_00);
  gmlc::libguarded::
  shared_lock_handle<gmlc::containers::DualMappedPointerVector<helics::PublicationInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
  ::operator->((shared_lock_handle<gmlc::containers::DualMappedPointerVector<helics::PublicationInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
                *)this_00);
  pPVar1 = gmlc::containers::
           DualMappedPointerVector<helics::PublicationInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>
           ::find(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  gmlc::libguarded::
  shared_lock_handle<gmlc::containers::DualMappedPointerVector<helics::PublicationInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
  ::~shared_lock_handle
            ((shared_lock_handle<gmlc::containers::DualMappedPointerVector<helics::PublicationInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
              *)0x5c289b);
  return pPVar1;
}

Assistant:

const PublicationInfo* InterfaceInfo::getPublication(InterfaceHandle handle) const
{
    return publications.lock()->find(handle);
}